

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * kj::str<float>(String *__return_storage_ptr__,float *params)

{
  float *value;
  CappedArray<char,_24UL> *params_00;
  CappedArray<char,_24UL> local_38;
  float *local_18;
  float *params_local;
  
  local_18 = params;
  params_local = (float *)__return_storage_ptr__;
  value = fwd<float>(params);
  toCharSequence<float>(&local_38,value);
  _::concat<kj::CappedArray<char,24ul>>(__return_storage_ptr__,(_ *)&local_38,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}